

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void load(char *filename)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    uVar2 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%d",C + uVar2);
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    fclose(__stream);
    return;
  }
  fwrite("error opening file\n",0x13,1,_stderr);
  getchar();
  exit(-1);
}

Assistant:

void load(char *filename) {
	FILE *fd; unsigned int i = 0;
	fd = fopen(filename, "r");
	if (fd == NULL) { 
		fprintf(stderr,"error opening file\n"); 
		getchar();
		exit(-1);
	}
	while (!feof(fd)) {
		fscanf(fd,"%d", &C[i++]);
	}
	//fprintf(stderr,"loaded %d instructions\n", i-1);
	fclose(fd);
}